

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O3

SinkResultType __thiscall
duckdb::PhysicalInsert::Sink
          (PhysicalInsert *this,ExecutionContext *context,DataChunk *insert_chunk,
          OperatorSinkInput *input)

{
  DataChunk *tuples;
  mutex *__mutex;
  DuckTableEntry *pDVar1;
  PhysicalInsert *pPVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  DataTable *table;
  shared_ptr<duckdb::DataTableInfo,_true> *psVar5;
  idx_t iVar6;
  undefined4 extraout_var_01;
  unsigned_long row_start;
  RowGroupCollection *pRVar7;
  pointer pRVar8;
  OptimisticDataWriter *this_00;
  PhysicalIndex PVar9;
  pointer this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  InsertLocalState *pIVar10;
  InsertGlobalState *pIVar11;
  _Head_base<0UL,_duckdb::RowGroupCollection_*,_false> local_a0;
  pthread_mutex_t *local_98;
  _Head_base<0UL,_duckdb::RowGroupCollection_*,_false> local_90;
  PhysicalInsert *local_88;
  InsertGlobalState *local_80;
  InsertLocalState *local_78;
  DuckTableEntry *local_70;
  shared_ptr<duckdb::DataTableInfo,_true> local_68;
  TableIOManager *local_58;
  DataTable *local_50;
  vector<duckdb::LogicalType,_true> local_48;
  undefined4 extraout_var_00;
  
  pIVar11 = (InsertGlobalState *)input->global_state;
  pIVar10 = (InsertLocalState *)input->local_state;
  pDVar1 = pIVar11->table;
  iVar4 = (*(pDVar1->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
            super_CatalogEntry._vptr_CatalogEntry[0x10])(pDVar1);
  local_98 = (pthread_mutex_t *)CONCAT44(extraout_var,iVar4);
  DataChunk::Flatten(insert_chunk);
  local_70 = pDVar1;
  if (this->parallel == false) {
    local_88 = (PhysicalInsert *)context;
    local_78 = pIVar10;
    iVar6 = OnConflictHandling(this,&pDVar1->super_TableCatalogEntry,context,pIVar11,pIVar10,
                               insert_chunk);
    pIVar11->insert_count = pIVar11->insert_count + iVar6 + insert_chunk->count;
    local_80 = pIVar11;
    if (this->return_chunk == true) {
      ColumnDataCollection::Append(&pIVar11->return_collection,insert_chunk);
    }
    DataTable::LocalAppend
              ((DataTable *)&local_98->__data,&local_70->super_TableCatalogEntry,
               *(ClientContext **)&local_88->super_PhysicalOperator,insert_chunk,
               &this->bound_constraints);
    pDVar1 = local_70;
    pIVar10 = local_78;
    pIVar11 = local_80;
    pPVar2 = local_88;
    if ((this->action_type == UPDATE) && ((local_78->update_chunk).count != 0)) {
      tuples = &local_78->update_chunk;
      HandleInsertConflicts<true>
                (&local_70->super_TableCatalogEntry,(ExecutionContext *)local_88,local_78,local_80,
                 tuples,this);
      HandleInsertConflicts<false>
                (&pDVar1->super_TableCatalogEntry,(ExecutionContext *)pPVar2,pIVar10,pIVar11,tuples,
                 this);
    }
  }
  else {
    local_88 = this;
    iVar4 = (*(pIVar11->table->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
              super_CatalogEntry._vptr_CatalogEntry[0x10])();
    table = (DataTable *)CONCAT44(extraout_var_00,iVar4);
    if ((pIVar10->collection_index).index == 0xffffffffffffffff) {
      local_78 = pIVar10;
      local_50 = table;
      psVar5 = DataTable::GetDataTableInfo((DataTable *)&local_98->__data);
      pPVar2 = local_88;
      local_98 = (pthread_mutex_t *)
                 (psVar5->internal).
                 super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_68.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (psVar5->internal).super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_68.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_68.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_68.internal.
                super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_68.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_68.internal.
                super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      local_80 = pIVar11;
      iVar4 = (*(local_70->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
                super_CatalogEntry._vptr_CatalogEntry[0x10])();
      local_58 = TableIOManager::Get((DataTable *)CONCAT44(extraout_var_01,iVar4));
      row_start = NumericCastImpl<unsigned_long,_long,_false>::Convert(0x7ffffffffff080);
      pRVar7 = (RowGroupCollection *)operator_new(0x90);
      local_68.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)local_98;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48,
                 &(pPVar2->insert_types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      RowGroupCollection::RowGroupCollection(pRVar7,&local_68,local_58,&local_48,row_start,0);
      table = local_50;
      local_a0._M_head_impl = pRVar7;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48);
      if (local_68.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.internal.
                   super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      pRVar8 = unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
               ::operator->((unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
                             *)&local_a0);
      RowGroupCollection::InitializeEmpty(pRVar8);
      pRVar8 = unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
               ::operator->((unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
                             *)&local_a0);
      RowGroupCollection::InitializeAppend(pRVar8,&local_78->local_append_state);
      __mutex = &local_80->lock;
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar4 != 0) {
        ::std::__throw_system_error(iVar4);
      }
      local_98 = (pthread_mutex_t *)__mutex;
      this_00 = (OptimisticDataWriter *)operator_new(0x10);
      pIVar11 = local_80;
      OptimisticDataWriter::OptimisticDataWriter(this_00,table);
      pIVar10 = local_78;
      ::std::
      __uniq_ptr_impl<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
      ::reset((__uniq_ptr_impl<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
               *)&local_78->optimistic_writer,this_00);
      local_90._M_head_impl = local_a0._M_head_impl;
      local_a0._M_head_impl = (RowGroupCollection *)0x0;
      PVar9 = DataTable::CreateOptimisticCollection
                        (table,context->client,
                         (unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
                          *)&local_90);
      (pIVar10->collection_index).index = PVar9.index;
      if (local_90._M_head_impl != (RowGroupCollection *)0x0) {
        ::std::default_delete<duckdb::RowGroupCollection>::operator()
                  ((default_delete<duckdb::RowGroupCollection> *)&local_90,local_90._M_head_impl);
      }
      local_90._M_head_impl = (RowGroupCollection *)0x0;
      pthread_mutex_unlock(local_98);
      pIVar10 = local_78;
      if (local_a0._M_head_impl != (RowGroupCollection *)0x0) {
        ::std::default_delete<duckdb::RowGroupCollection>::operator()
                  ((default_delete<duckdb::RowGroupCollection> *)&local_a0,local_a0._M_head_impl);
        pIVar10 = local_78;
      }
    }
    OnConflictHandling(local_88,&local_70->super_TableCatalogEntry,context,pIVar11,pIVar10,
                       insert_chunk);
    pRVar7 = DataTable::GetOptimisticCollection
                       (table,context->client,(PhysicalIndex)(pIVar10->collection_index).index);
    bVar3 = RowGroupCollection::Append(pRVar7,insert_chunk,&pIVar10->local_append_state);
    if (bVar3) {
      this_01 = unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
                ::operator->(&pIVar10->optimistic_writer);
      OptimisticDataWriter::WriteNewRowGroup(this_01,pRVar7);
    }
  }
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalInsert::Sink(ExecutionContext &context, DataChunk &insert_chunk,
                                    OperatorSinkInput &input) const {
	auto &gstate = input.global_state.Cast<InsertGlobalState>();
	auto &lstate = input.local_state.Cast<InsertLocalState>();

	auto &table = gstate.table;
	auto &storage = table.GetStorage();
	insert_chunk.Flatten();

	if (!parallel) {
		idx_t updated_tuples = OnConflictHandling(table, context, gstate, lstate, insert_chunk);

		gstate.insert_count += insert_chunk.size();
		gstate.insert_count += updated_tuples;
		if (return_chunk) {
			gstate.return_collection.Append(insert_chunk);
		}
		storage.LocalAppend(table, context.client, insert_chunk, bound_constraints);
		if (action_type == OnConflictAction::UPDATE && lstate.update_chunk.size() != 0) {
			(void)HandleInsertConflicts<true>(table, context, lstate, gstate, lstate.update_chunk, *this);
			(void)HandleInsertConflicts<false>(table, context, lstate, gstate, lstate.update_chunk, *this);
			// All of the tuples should have been turned into an update, leaving the chunk empty afterwards
			D_ASSERT(lstate.update_chunk.size() == 0);
		}
		return SinkResultType::NEED_MORE_INPUT;
	}

	// Parallel append.
	D_ASSERT(!return_chunk);
	auto &data_table = gstate.table.GetStorage();
	if (!lstate.collection_index.IsValid()) {
		auto table_info = storage.GetDataTableInfo();
		auto &io_manager = TableIOManager::Get(table.GetStorage());

		// Create the local row group collection.
		auto max_row_id = NumericCast<idx_t>(MAX_ROW_ID);
		auto collection = make_uniq<RowGroupCollection>(std::move(table_info), io_manager, insert_types, max_row_id);
		collection->InitializeEmpty();
		collection->InitializeAppend(lstate.local_append_state);

		lock_guard<mutex> l(gstate.lock);
		lstate.optimistic_writer = make_uniq<OptimisticDataWriter>(data_table);
		lstate.collection_index = data_table.CreateOptimisticCollection(context.client, std::move(collection));
	}

	OnConflictHandling(table, context, gstate, lstate, insert_chunk);
	D_ASSERT(action_type != OnConflictAction::UPDATE);

	auto &collection = data_table.GetOptimisticCollection(context.client, lstate.collection_index);
	auto new_row_group = collection.Append(insert_chunk, lstate.local_append_state);
	if (new_row_group) {
		lstate.optimistic_writer->WriteNewRowGroup(collection);
	}
	return SinkResultType::NEED_MORE_INPUT;
}